

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

void jp2_write_jp2h(opj_jp2_t *jp2,opj_cio_t *cio)

{
  int pos;
  int iVar1;
  int iVar2;
  ulong uVar3;
  unsigned_long_long v;
  long lVar4;
  
  pos = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x6a703268,4);
  iVar1 = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x69686472,4);
  cio_write(cio,(ulong)jp2->h,4);
  cio_write(cio,(ulong)jp2->w,4);
  cio_write(cio,(ulong)jp2->numcomps,2);
  cio_write(cio,(ulong)jp2->bpc,1);
  cio_write(cio,(ulong)jp2->C,1);
  cio_write(cio,(ulong)jp2->UnkC,1);
  cio_write(cio,(ulong)jp2->IPR,1);
  iVar2 = cio_tell(cio);
  cio_seek(cio,iVar1);
  cio_write(cio,(ulong)(uint)(iVar2 - iVar1),4);
  cio_seek(cio,iVar2);
  if (jp2->bpc == 0xff) {
    iVar1 = cio_tell(cio);
    cio_skip(cio,4);
    cio_write(cio,0x62706363,4);
    lVar4 = 8;
    for (uVar3 = 0; uVar3 < jp2->numcomps; uVar3 = uVar3 + 1) {
      cio_write(cio,(ulong)*(uint *)((long)&jp2->comps->depth + lVar4),1);
      lVar4 = lVar4 + 0xc;
    }
    iVar2 = cio_tell(cio);
    cio_seek(cio,iVar1);
    cio_write(cio,(ulong)(uint)(iVar2 - iVar1),4);
    cio_seek(cio,iVar2);
  }
  iVar1 = cio_tell(cio);
  cio_skip(cio,4);
  cio_write(cio,0x636f6c72,4);
  cio_write(cio,(ulong)jp2->meth,1);
  cio_write(cio,(ulong)jp2->precedence,1);
  cio_write(cio,(ulong)jp2->approx,1);
  if (jp2->meth == 2) {
    jp2->enumcs = 0;
    v = 0;
  }
  else {
    v = (unsigned_long_long)jp2->enumcs;
  }
  cio_write(cio,v,4);
  iVar2 = cio_tell(cio);
  cio_seek(cio,iVar1);
  cio_write(cio,(ulong)(uint)(iVar2 - iVar1),4);
  cio_seek(cio,iVar2);
  iVar1 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(ulong)(uint)(iVar1 - pos),4);
  cio_seek(cio,iVar1);
  return;
}

Assistant:

void jp2_write_jp2h(opj_jp2_t *jp2, opj_cio_t *cio) {
	opj_jp2_box_t box;

	box.init_pos = cio_tell(cio);
	cio_skip(cio, 4);
	cio_write(cio, JP2_JP2H, 4);	/* JP2H */

	jp2_write_ihdr(jp2, cio);

	if (jp2->bpc == 255) {
		jp2_write_bpcc(jp2, cio);
	}
	jp2_write_colr_orig(jp2, cio);

	box.length = cio_tell(cio) - box.init_pos;
	cio_seek(cio, box.init_pos);
	cio_write(cio, box.length, 4);	/* L */
	cio_seek(cio, box.init_pos + box.length);
}